

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O2

int chachapoly_crypt_and_tag
              (mbedtls_chachapoly_context *ctx,mbedtls_chachapoly_mode_t mode,size_t length,
              uchar *nonce,uchar *aad,size_t aad_len,uchar *input,uchar *output,uchar *tag)

{
  int iVar1;
  
  iVar1 = mbedtls_chachapoly_starts(ctx,nonce,mode);
  if (iVar1 == 0) {
    iVar1 = mbedtls_chachapoly_update_aad(ctx,aad,aad_len);
    if (iVar1 == 0) {
      iVar1 = mbedtls_chachapoly_update(ctx,length,input,output);
      if (iVar1 == 0) {
        iVar1 = mbedtls_chachapoly_finish(ctx,tag);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int chachapoly_crypt_and_tag( mbedtls_chachapoly_context *ctx,
                                     mbedtls_chachapoly_mode_t mode,
                                     size_t length,
                                     const unsigned char nonce[12],
                                     const unsigned char *aad,
                                     size_t aad_len,
                                     const unsigned char *input,
                                     unsigned char *output,
                                     unsigned char tag[16] )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    ret = mbedtls_chachapoly_starts( ctx, nonce, mode );
    if( ret != 0 )
        goto cleanup;

    ret = mbedtls_chachapoly_update_aad( ctx, aad, aad_len );
    if( ret != 0 )
        goto cleanup;

    ret = mbedtls_chachapoly_update( ctx, length, input, output );
    if( ret != 0 )
        goto cleanup;

    ret = mbedtls_chachapoly_finish( ctx, tag );

cleanup:
    return( ret );
}